

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_core.cpp
# Opt level: O0

void __thiscall
so_5::impl::layer_core_t::add_extra_layer(layer_core_t *this,type_index *type,layer_ref_t *layer)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  iterator __first;
  iterator __last;
  so_layer_list_t *this_00;
  exception *x_1;
  __normal_iterator<so_5::impl::typed_layer_ref_t_*,_std::vector<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>_>
  local_148;
  const_iterator local_140;
  undefined1 local_138 [8];
  typed_layer_ref_t typed_layer;
  exception *x;
  string local_c8 [32];
  __normal_iterator<const_so_5::impl::typed_layer_ref_t_*,_std::vector<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>_>
  local_a8;
  __normal_iterator<so_5::impl::typed_layer_ref_t_*,_std::vector<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>_>
  local_a0;
  lock_guard<std::mutex> local_98;
  lock_guard<std::mutex> lock;
  string local_88 [32];
  __normal_iterator<const_so_5::impl::typed_layer_ref_t_*,_std::vector<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>_>
  local_68;
  __normal_iterator<so_5::impl::typed_layer_ref_t_*,_std::vector<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>_>
  local_60 [3];
  allocator local_41;
  string local_40 [32];
  __shared_ptr_access<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_20;
  layer_ref_t *layer_local;
  type_index *type_local;
  layer_core_t *this_local;
  
  local_20 = (__shared_ptr_access<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)layer;
  layer_local = (layer_ref_t *)type;
  type_local = (type_index *)this;
  peVar2 = std::__shared_ptr<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2>::get
                     (&layer->super___shared_ptr<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2>);
  if (peVar2 == (element_type *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"trying to add nullptr extra layer",&local_41);
    exception_t::raise(0x51ce18);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  local_60[0]._M_current =
       (typed_layer_ref_t *)
       std::vector<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>::
       end(&this->m_default_layers);
  local_68._M_current =
       (typed_layer_ref_t *)search_for_layer(&this->m_default_layers,(type_index *)layer_local);
  bVar1 = __gnu_cxx::operator!=(local_60,&local_68);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88,"trying to add extra layer that already exists in default list",
               (allocator *)((long)&lock._M_device + 7));
    exception_t::raise(0x51ce18);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&lock._M_device + 7));
  }
  std::lock_guard<std::mutex>::lock_guard(&local_98,&this->m_extra_layers_lock);
  local_a0._M_current =
       (typed_layer_ref_t *)
       std::vector<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>::
       end(&this->m_extra_layers);
  local_a8._M_current =
       (typed_layer_ref_t *)search_for_layer(&this->m_extra_layers,(type_index *)layer_local);
  bVar1 = __gnu_cxx::operator!=(&local_a0,&local_a8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c8,"trying to add extra layer that already exists in extra list",
               (allocator *)((long)&x + 7));
    exception_t::raise(0x51ce18);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&x + 7));
  }
  peVar3 = std::__shared_ptr_access<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_20);
  layer_t::bind_to_environment(peVar3,this->m_env);
  peVar3 = std::__shared_ptr_access<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_20);
  (*peVar3->_vptr_layer_t[2])();
  typed_layer_ref_t::typed_layer_ref_t
            ((typed_layer_ref_t *)local_138,(type_index *)layer_local,(layer_ref_t *)local_20);
  this_00 = &this->m_extra_layers;
  __first = std::
            vector<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>::
            begin(this_00);
  __last = std::
           vector<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>::
           end(this_00);
  local_148 = std::
              lower_bound<__gnu_cxx::__normal_iterator<so_5::impl::typed_layer_ref_t*,std::vector<so_5::impl::typed_layer_ref_t,std::allocator<so_5::impl::typed_layer_ref_t>>>,so_5::impl::typed_layer_ref_t>
                        (__first._M_current,__last._M_current,(typed_layer_ref_t *)local_138);
  __gnu_cxx::
  __normal_iterator<so_5::impl::typed_layer_ref_t_const*,std::vector<so_5::impl::typed_layer_ref_t,std::allocator<so_5::impl::typed_layer_ref_t>>>
  ::__normal_iterator<so_5::impl::typed_layer_ref_t*>
            ((__normal_iterator<so_5::impl::typed_layer_ref_t_const*,std::vector<so_5::impl::typed_layer_ref_t,std::allocator<so_5::impl::typed_layer_ref_t>>>
              *)&local_140,&local_148);
  std::vector<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>::insert
            (this_00,local_140,(value_type *)local_138);
  typed_layer_ref_t::~typed_layer_ref_t((typed_layer_ref_t *)local_138);
  std::lock_guard<std::mutex>::~lock_guard(&local_98);
  return;
}

Assistant:

void
layer_core_t::add_extra_layer(
	const std::type_index & type,
	const layer_ref_t & layer )
{
	if( nullptr == layer.get() )
		SO_5_THROW_EXCEPTION(
			rc_trying_to_add_nullptr_extra_layer,
			"trying to add nullptr extra layer" );

	if( m_default_layers.end() != search_for_layer( m_default_layers, type ) )
		SO_5_THROW_EXCEPTION(
			rc_trying_to_add_extra_layer_that_already_exists_in_default_list,
			"trying to add extra layer that already exists in default list" );

	std::lock_guard< std::mutex > lock( m_extra_layers_lock );

	if( m_extra_layers.end() != search_for_layer( m_extra_layers, type ) )
		SO_5_THROW_EXCEPTION(
			rc_trying_to_add_extra_layer_that_already_exists_in_extra_list,
			"trying to add extra layer that already exists in extra list" );

	layer->bind_to_environment( &m_env );

	try
	{
		layer->start();
	}
	catch( const std::exception & x )
	{
		SO_5_THROW_EXCEPTION(
			rc_unable_to_start_extra_layer,
			std::string( "layer raised an exception: " ) + x.what() );
	}

	try
	{
		typed_layer_ref_t typed_layer( type, layer );

		m_extra_layers.insert(
			std::lower_bound(
				m_extra_layers.begin(),
				m_extra_layers.end(),
				typed_layer ),
			typed_layer );
	}
	catch( const std::exception & x )
	{
		// Unable to store layer. Layer must be stopped...
		layer->shutdown();
		layer->wait();

		// ...And error must be reported.
		SO_5_THROW_EXCEPTION(
			rc_unable_to_start_extra_layer,
			std::string( "unable to store pointer to layer, exception: " ) +
				x.what() );
	}
}